

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall QWidgetTextControlPrivate::startDrag(QWidgetTextControlPrivate *this)

{
  Data *pDVar1;
  int iVar2;
  QDrag *this_00;
  QObject *pQVar3;
  QObject *pQVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  pDVar1 = (this->contextWidget).wp.d;
  this->mousePressed = false;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->contextWidget).wp.value != (QObject *)0x0)) {
    (**(code **)(**(long **)&this->field_0x8 + 0x98))();
    this_00 = (QDrag *)operator_new(0x10);
    pDVar1 = (this->contextWidget).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = (this->contextWidget).wp.value;
    }
    QDrag::QDrag(this_00,pQVar3);
    QDrag::setMimeData((QMimeData *)this_00);
    if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
         super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0) {
      uVar6 = 1;
      uVar5 = 1;
    }
    else {
      uVar6 = 3;
      uVar5 = 2;
    }
    iVar2 = QDrag::exec(this_00,uVar6,uVar5);
    if (iVar2 == 2) {
      pQVar3 = (QObject *)QDrag::target();
      pDVar1 = (this->contextWidget).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar4 = (QObject *)0x0;
      }
      else {
        pQVar4 = (this->contextWidget).wp.value;
      }
      if (pQVar4 != pQVar3) {
        QTextCursor::removeSelectedText();
        return;
      }
    }
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::startDrag()
{

#ifdef Q_OS_WASM
    // QDrag::exec() will crash without asyncify; disable drag instead.
    if (!qstdweb::haveAsyncify())
        return;
#endif

#if QT_CONFIG(draganddrop)
    Q_Q(QWidgetTextControl);
    mousePressed = false;
    if (!contextWidget)
        return;
    QMimeData *data = q->createMimeDataFromSelection();

    QDrag *drag = new QDrag(contextWidget);
    drag->setMimeData(data);

    Qt::DropActions actions = Qt::CopyAction;
    Qt::DropAction action;
    if (interactionFlags & Qt::TextEditable) {
        actions |= Qt::MoveAction;
        action = drag->exec(actions, Qt::MoveAction);
    } else {
        action = drag->exec(actions, Qt::CopyAction);
    }

    if (action == Qt::MoveAction && drag->target() != contextWidget)
        cursor.removeSelectedText();
#endif
}